

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_owner.c
# Opt level: O2

void test_archive_match_owner(void)

{
  wchar_t wVar1;
  archive *paVar2;
  archive_entry *paVar3;
  
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'#',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'%',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_uid(paVar2,1000);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'*',0,"0",(long)wVar1,"archive_match_include_uid(m, 1000)",paVar2);
      wVar1 = archive_match_include_uid(paVar2,0x3ea);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'+',0,"0",(long)wVar1,"archive_match_include_uid(m, 1002)",paVar2);
      archive_entry_set_uid(paVar3,0);
      failure("uid 0 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'/',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'0',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_uid(paVar3,1000);
      failure("uid 1000 should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'3',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'4',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_uid(paVar3,0x3e9);
      failure("uid 1001 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'7',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'8',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_uid(paVar3,0x3ea);
      failure("uid 1002 should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L';',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'<',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_uid(paVar3,0x3eb);
      failure("uid 1003 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'?',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'@',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'M',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'O',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_gid(paVar2,1000);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'T',0,"0",(long)wVar1,"archive_match_include_gid(m, 1000)",paVar2);
      wVar1 = archive_match_include_gid(paVar2,0x3ea);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'U',0,"0",(long)wVar1,"archive_match_include_gid(m, 1002)",paVar2);
      archive_entry_set_gid(paVar3,0);
      failure("uid 0 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Y',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Z',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(paVar3,1000);
      failure("uid 1000 should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L']',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'^',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(paVar3,0x3e9);
      failure("uid 1001 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'a',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'b',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(paVar3,0x3ea);
      failure("uid 1002 should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'e',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'f',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_set_gid(paVar3,0x3eb);
      failure("uid 1003 should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'i',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'j',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'w',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'y',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_uname(paVar2,"foo");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'~',0,"0",(long)wVar1,"archive_match_include_uname(m, \"foo\")",paVar2);
      wVar1 = archive_match_include_uname(paVar2,"bar");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x7f',0,"0",(long)wVar1,"archive_match_include_uname(m, \"bar\")",
                          paVar2);
      archive_entry_copy_uname(paVar3,"unknown");
      failure("User \'unknown\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x83',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",
                          (void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x84',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname(paVar3,"foo");
      failure("User \'foo\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x87',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",
                          (void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x88',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname(paVar3,"foo1");
      failure("User \'foo1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x8b',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",
                          (void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x8c',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname(paVar3,"bar");
      failure("User \'bar\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x8f',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",
                          (void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x90',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname(paVar3,"bar1");
      failure("User \'bar1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x93',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",
                          (void *)0x0);
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'\x94',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'¡',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'£',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_uname_w(paVar2,anon_var_dwarf_ac05);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'¨',0,"0",(long)wVar1,"archive_match_include_uname_w(m, L\"foo\")",
                          paVar2);
      wVar1 = archive_match_include_uname_w(paVar2,anon_var_dwarf_ac35);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'©',0,"0",(long)wVar1,"archive_match_include_uname_w(m, L\"bar\")",
                          paVar2);
      archive_entry_copy_uname_w(paVar3,anon_var_dwarf_ac49);
      failure("User \'unknown\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'­',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'®',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname_w(paVar3,anon_var_dwarf_ac05);
      failure("User \'foo\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'±',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'²',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname_w(paVar3,anon_var_dwarf_ac5f);
      failure("User \'foo1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'µ',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'¶',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname_w(paVar3,anon_var_dwarf_ac35);
      failure("User \'bar\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'¹',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'º',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_uname_w(paVar3,anon_var_dwarf_ac75);
      failure("User \'bar1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'½',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'¾',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'Ë',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'Í',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_gname(paVar2,"foo");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ò',0,"0",(long)wVar1,"archive_match_include_gname(m, \"foo\")",paVar2)
      ;
      wVar1 = archive_match_include_gname(paVar2,"bar");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ó',0,"0",(long)wVar1,"archive_match_include_gname(m, \"bar\")",paVar2)
      ;
      archive_entry_copy_gname(paVar3,"unknown");
      failure("Group \'unknown\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'×',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ø',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname(paVar3,"foo");
      failure("Group \'foo\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Û',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ü',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname(paVar3,"foo1");
      failure("Group \'foo1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ß',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'à',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname(paVar3,"bar");
      failure("Group \'bar\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ã',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ä',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname(paVar3,"bar1");
      failure("Group \'bar1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ç',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'è',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
  }
  paVar2 = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                           ,L'õ',(uint)(paVar2 != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    paVar3 = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                             ,L'÷',(uint)(paVar3 != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 != L'\0') {
      wVar1 = archive_match_include_gname_w(paVar2,anon_var_dwarf_ac05);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ü',0,"0",(long)wVar1,"archive_match_include_gname_w(m, L\"foo\")",
                          paVar2);
      wVar1 = archive_match_include_gname_w(paVar2,anon_var_dwarf_ac35);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ý',0,"0",(long)wVar1,"archive_match_include_gname_w(m, L\"bar\")",
                          paVar2);
      archive_entry_copy_gname_w(paVar3,anon_var_dwarf_ac49);
      failure("Group \'unknown\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ā',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ă',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname_w(paVar3,anon_var_dwarf_ac05);
      failure("Group \'foo\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ą',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ć',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname_w(paVar3,anon_var_dwarf_ac5f);
      failure("Group \'foo1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'ĉ',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ċ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname_w(paVar3,anon_var_dwarf_ac35);
      failure("Group \'bar\' should not be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'č',0,"0",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ď',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_gname_w(paVar3,anon_var_dwarf_ac75);
      failure("Group \'bar1\' should be excluded");
      wVar1 = archive_match_owner_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'đ',1,"1",(long)wVar1,"archive_match_owner_excluded(m, ae)",(void *)0x0
                         );
      wVar1 = archive_match_excluded(paVar2,paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_match_owner.c"
                          ,L'Ē',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_free(paVar3);
    }
    archive_match_free(paVar2);
    return;
  }
  return;
}

Assistant:

static void
test_uid(void)
{
	struct archive_entry *ae;
	struct archive *m;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	assertEqualIntA(m, 0, archive_match_include_uid(m, 1000));
	assertEqualIntA(m, 0, archive_match_include_uid(m, 1002));

	archive_entry_set_uid(ae, 0);
	failure("uid 0 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1000);
	failure("uid 1000 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1001);
	failure("uid 1001 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1002);
	failure("uid 1002 should not be excluded");
	assertEqualInt(0, archive_match_owner_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_set_uid(ae, 1003);
	failure("uid 1003 should be excluded");
	assertEqualInt(1, archive_match_owner_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}